

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

bool gflags::GetCommandLineFlagInfo(char *name,CommandLineFlagInfo *OUTPUT)

{
  CommandLineFlag *this;
  CommandLineFlag *flag;
  FlagRegistryLock frl;
  FlagRegistry *registry;
  CommandLineFlagInfo *OUTPUT_local;
  char *name_local;
  
  if (name == (char *)0x0) {
    name_local._7_1_ = false;
  }
  else {
    frl.fr_ = anon_unknown_2::FlagRegistry::GlobalRegistry();
    anon_unknown_2::FlagRegistryLock::FlagRegistryLock((FlagRegistryLock *)&flag,frl.fr_);
    this = anon_unknown_2::FlagRegistry::FindFlagLocked(frl.fr_,name);
    if (this == (CommandLineFlag *)0x0) {
      name_local._7_1_ = false;
    }
    else {
      if (OUTPUT == (CommandLineFlagInfo *)0x0) {
        __assert_fail("OUTPUT",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/build_O0/_deps/gflags-src/src/gflags.cc"
                      ,0x658,
                      "bool gflags::GetCommandLineFlagInfo(const char *, CommandLineFlagInfo *)");
      }
      anon_unknown_2::CommandLineFlag::FillCommandLineFlagInfo(this,OUTPUT);
      name_local._7_1_ = true;
    }
    anon_unknown_2::FlagRegistryLock::~FlagRegistryLock((FlagRegistryLock *)&flag);
  }
  return name_local._7_1_;
}

Assistant:

bool GetCommandLineFlagInfo(const char* name, CommandLineFlagInfo* OUTPUT) {
  if (NULL == name) return false;
  FlagRegistry* const registry = FlagRegistry::GlobalRegistry();
  FlagRegistryLock frl(registry);
  CommandLineFlag* flag = registry->FindFlagLocked(name);
  if (flag == NULL) {
    return false;
  } else {
    assert(OUTPUT);
    flag->FillCommandLineFlagInfo(OUTPUT);
    return true;
  }
}